

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoding.c
# Opt level: O0

exr_result_t read_uncompressed_direct(exr_decode_pipeline_t *decode)

{
  char *pcVar1;
  long lVar2;
  long lVar3;
  long *in_RDI;
  exr_coding_channel_info_t *decc;
  int c;
  int y;
  _internal_exr_part *part;
  _internal_exr_context *pctxt;
  uint8_t *cdata;
  uint64_t toread;
  uint64_t dataoffset;
  int start_y;
  int height;
  exr_result_t rv;
  int iVar4;
  int local_4c;
  undefined8 uVar5;
  void *local_38;
  long local_28;
  int local_1c;
  int local_18;
  int local_14;
  long *local_10;
  exr_result_t local_4;
  
  pcVar1 = (char *)in_RDI[2];
  if (pcVar1 == (char *)0x0) {
    local_4 = 2;
  }
  else if (*pcVar1 == '\0') {
    if ((*(int *)((long)in_RDI + 0xc) < 0) ||
       (*(int *)(pcVar1 + 0xc4) <= *(int *)((long)in_RDI + 0xc))) {
      local_4 = (**(code **)(pcVar1 + 0x48))
                          (pcVar1,4,"Part index (%d) out of range",
                           *(undefined4 *)((long)in_RDI + 0xc));
    }
    else {
      uVar5 = *(undefined8 *)(*(long *)(pcVar1 + 0x1d8) + (long)*(int *)((long)in_RDI + 0xc) * 8);
      local_28 = in_RDI[6];
      local_18 = *(int *)((long)in_RDI + 0x24);
      local_1c = (int)in_RDI[4];
      local_10 = in_RDI;
      for (local_4c = 0; local_4c < local_18; local_4c = local_4c + 1) {
        for (iVar4 = 0; iVar4 < (short)local_10[1]; iVar4 = iVar4 + 1) {
          lVar2 = *local_10 + (long)iVar4 * 0x30;
          if (*(int *)(lVar2 + 8) != 0) {
            if (*(int *)(lVar2 + 0x14) < 2) {
              lVar3 = (long)local_4c * (long)*(int *)(lVar2 + 0x24);
            }
            else {
              if ((local_1c + local_4c) % *(int *)(lVar2 + 0x14) != 0) goto LAB_0014d728;
              lVar3 = (long)(local_4c / *(int *)(lVar2 + 0x14)) * (long)*(int *)(lVar2 + 0x24);
            }
            local_38 = (void *)(lVar3 + *(long *)(lVar2 + 0x28));
            local_14 = (**(code **)(pcVar1 + 0x28))
                                 (pcVar1,local_38,
                                  (long)*(int *)(lVar2 + 0xc) * (long)*(char *)(lVar2 + 0x19),
                                  &local_28,0,0,lVar2,iVar4,uVar5);
            if (local_14 != 0) {
              return local_14;
            }
            if (*(char *)(lVar2 + 0x19) == '\x02') {
              priv_to_native16(local_38,*(int *)(lVar2 + 0xc));
            }
            else {
              priv_to_native32(local_38,*(int *)(lVar2 + 0xc));
            }
          }
LAB_0014d728:
        }
      }
      local_4 = 0;
    }
  }
  else {
    local_4 = (**(code **)(pcVar1 + 0x38))(pcVar1,7);
  }
  return local_4;
}

Assistant:

static exr_result_t
read_uncompressed_direct (exr_decode_pipeline_t* decode)
{
    exr_result_t rv;
    int          height, start_y;
    uint64_t     dataoffset, toread;
    uint8_t*     cdata;
    EXR_PROMOTE_READ_CONST_CONTEXT_AND_PART_OR_ERROR (
        decode->context, decode->part_index);

    dataoffset = decode->chunk.data_offset;

    height  = decode->chunk.height;
    start_y = decode->chunk.start_y;
    for (int y = 0; y < height; ++y)
    {
        for (int c = 0; c < decode->channel_count; ++c)
        {
            exr_coding_channel_info_t* decc = (decode->channels + c);

            cdata = decc->decode_to_ptr;
            toread =
                (uint64_t) decc->width * (uint64_t) decc->bytes_per_element;

            if (decc->height == 0) continue;

            if (decc->y_samples > 1)
            {
                if (((start_y + y) % decc->y_samples) != 0) continue;
                cdata +=
                    ((uint64_t) (y / decc->y_samples) *
                     (uint64_t) decc->user_line_stride);
            }
            else
            {
                cdata += (uint64_t) y * (uint64_t) decc->user_line_stride;
            }

            /* actual read into the output pointer */
            rv = pctxt->do_read (
                pctxt, cdata, toread, &dataoffset, NULL, EXR_MUST_READ_ALL);
            if (rv != EXR_ERR_SUCCESS) return rv;

            // need to swab them to native
            if (decc->bytes_per_element == 2)
                priv_to_native16 (cdata, decc->width);
            else
                priv_to_native32 (cdata, decc->width);
        }
    }

    return EXR_ERR_SUCCESS;
}